

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track.c
# Opt level: O2

vmd_note_t * vmd_track_insert(vmd_track_t *track,vmd_time_t beg,vmd_time_t end,vmd_pitch_t pitch)

{
  vmd_channel_t *pvVar1;
  int value;
  vmd_note_t *note;
  vmd_note_t n;
  vmd_note_t local_50;
  
  local_50.on_vel = '@';
  local_50.off_vel = '@';
  local_50.pitch = 0;
  local_50.midipitch = '\0';
  local_50.mark = '\0';
  local_50.track = track;
  local_50.on_time = beg;
  local_50.off_time = end;
  local_50.channel = vmd_track_temp_channel(track,beg,end,(vmd_note_t *)0x0);
  local_50.next = (vmd_note_t *)0x0;
  note = vmd_insert_note(&local_50);
  vmd_note_reset_pitch(note,pitch);
  pvVar1 = note->channel;
  value = vmd_track_get_ctrl(track,0x80);
  vmd_map_set_range(pvVar1->ctrl + 0x80,beg,end,value);
  return note;
}

Assistant:

note_t *
track_insert(track_t *track, time_t beg, time_t end, pitch_t pitch)
{
	note_t n = {
		.track = track,
		.channel = track_temp_channel(track, beg, end, NULL),

		.on_time = beg,
		.on_vel = DEFAULT_VELOCITY,

		.off_time = end,
		.off_vel = DEFAULT_VELOCITY,
	};

	note_t *note = insert_note(&n);
	note_reset_pitch(note, pitch);
	map_set_range(&note->channel->ctrl[CCTRL_PROGRAM], beg, end, track_get_ctrl(track, CCTRL_PROGRAM));
	return note;
}